

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status leveldb::anon_unknown_1::PosixWritableFile::SyncFd(int fd,string *fd_path)

{
  int iVar1;
  int in_ESI;
  char *in_RDI;
  int in_stack_00000014;
  string *in_stack_00000018;
  bool sync_success;
  
  iVar1 = fdatasync(in_ESI);
  if (iVar1 == 0) {
    Status::OK();
  }
  else {
    __errno_location();
    PosixError(in_stack_00000018,in_stack_00000014);
  }
  return (Status)in_RDI;
}

Assistant:

static Status SyncFd(int fd, const std::string& fd_path) {
#if HAVE_FULLFSYNC
    // On macOS and iOS, fsync() doesn't guarantee durability past power
    // failures. fcntl(F_FULLFSYNC) is required for that purpose. Some
    // filesystems don't support fcntl(F_FULLFSYNC), and require a fallback to
    // fsync().
    if (::fcntl(fd, F_FULLFSYNC) == 0) {
      return Status::OK();
    }
#endif  // HAVE_FULLFSYNC

#if HAVE_FDATASYNC
    bool sync_success = ::fdatasync(fd) == 0;
#else
    bool sync_success = ::fsync(fd) == 0;
#endif  // HAVE_FDATASYNC

    if (sync_success) {
      return Status::OK();
    }
    return PosixError(fd_path, errno);
  }